

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * pack31_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * -0x80000000 | uVar1 - base;
  uVar2 = in[1] - base >> 1;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x40000000 | uVar2;
  uVar2 = in[2] - base >> 2;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x20000000 | uVar2;
  uVar2 = in[3] - base >> 3;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x10000000 | uVar2;
  uVar2 = in[4] - base >> 4;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x8000000 | uVar2;
  uVar2 = in[5] - base >> 5;
  out[5] = uVar2;
  out[5] = (in[6] - base) * 0x4000000 | uVar2;
  uVar2 = in[6] - base >> 6;
  out[6] = uVar2;
  out[6] = (in[7] - base) * 0x2000000 | uVar2;
  out[7] = in[7] - base >> 7;
  return out + 8;
}

Assistant:

uint32_t * pack31_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  31 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  30 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  30 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  29 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  28 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  27 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  26 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  26 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  25 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  25 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 31  -  24 );
    ++in;

    return out + 1;
}